

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O2

uint64_t duckdb::NumericRangeInfo::ListLength
                   (int64_t start_value,int64_t end_value,int64_t increment_value,
                   bool inclusive_bound)

{
  hugeint_t a;
  hugeint_t input;
  bool bVar1;
  uint64_t uVar2;
  InvalidInputException *this;
  hugeint_t hVar3;
  uint64_t uStack_a8;
  hugeint_t total_values;
  hugeint_t local_90;
  hugeint_t local_70;
  hugeint_t increment;
  hugeint_t local_50;
  hugeint_t total_diff;
  
  if (((increment_value == 0) || (end_value < start_value && 0 < increment_value)) ||
     (start_value < end_value && increment_value < 0)) {
    uVar2 = 0;
  }
  else {
    hugeint_t::hugeint_t(&local_90,end_value);
    hugeint_t::hugeint_t(&increment,start_value);
    hugeint_t::operator-(&local_90,&increment);
    hVar3.upper = total_values.lower;
    hVar3.lower = uStack_a8;
    total_diff = AbsValue<duckdb::hugeint_t>(hVar3);
    hugeint_t::hugeint_t(&local_50,increment_value);
    a.upper = total_values.lower;
    a.lower = uStack_a8;
    increment = AbsValue<duckdb::hugeint_t>(a);
    hVar3 = hugeint_t::operator/(&total_diff,&increment);
    total_values.lower = hVar3.lower;
    total_values.upper = hVar3.upper;
    local_90 = hugeint_t::operator%(&total_diff,&increment);
    hugeint_t::hugeint_t(&local_70,0);
    bVar1 = hugeint_t::operator==(&local_90,&local_70);
    if ((!bVar1) || (inclusive_bound)) {
      hugeint_t::hugeint_t(&local_90,1);
      hugeint_t::operator+=(&total_values,&local_90);
    }
    hugeint_t::hugeint_t(&local_90,0xffffffff);
    bVar1 = hugeint_t::operator>(&total_values,&local_90);
    if (bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_90,"Lists larger than 2^32 elements are not supported",
                 (allocator *)&local_70);
      InvalidInputException::InvalidInputException(this,(string *)&local_90);
      __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    input.upper = total_values.upper;
    input.lower = total_values.lower;
    uVar2 = Hugeint::Cast<unsigned_long>(input);
  }
  return uVar2;
}

Assistant:

static uint64_t ListLength(int64_t start_value, int64_t end_value, int64_t increment_value, bool inclusive_bound) {
		if (increment_value == 0) {
			return 0;
		}
		if (start_value > end_value && increment_value > 0) {
			return 0;
		}
		if (start_value < end_value && increment_value < 0) {
			return 0;
		}
		hugeint_t total_diff = AbsValue(hugeint_t(end_value) - hugeint_t(start_value));
		hugeint_t increment = AbsValue(hugeint_t(increment_value));
		hugeint_t total_values = total_diff / increment;
		if (total_diff % increment == 0) {
			if (inclusive_bound) {
				total_values += 1;
			}
		} else {
			total_values += 1;
		}
		if (total_values > NumericLimits<uint32_t>::Maximum()) {
			throw InvalidInputException("Lists larger than 2^32 elements are not supported");
		}
		return Hugeint::Cast<uint64_t>(total_values);
	}